

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdatePolish_Test::TestBody
          (OsqpTest_GetAndUpdatePolish_Test *this)

{
  pointer *__ptr_1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  bool bVar1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  OsqpSolver solver;
  AssertionResult gtest_ar;
  OsqpSettings settings;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a8;
  AssertHelper local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  anon_union_8_1_1246618d_for_StatusOrData<bool>_1 local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  AssertHelper local_180;
  undefined1 local_178 [8];
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  Scalar *local_150;
  CompressedStorage<double,_long_long> local_148;
  void *local_128;
  StorageIndex *local_100;
  Scalar *local_f8;
  CompressedStorage<double,_long_long> local_f0;
  void *local_d0;
  void *local_c0;
  OsqpSettings local_b0;
  
  OsqpSettings::OsqpSettings(&local_b0);
  local_b0.polish = true;
  local_178 = (undefined1  [8])0x0;
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_1a0,(OsqpInstance *)local_178,(OsqpSettings *)local_170);
  local_190.status_.rep_._0_1_ =
       (StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) == (StatusRep *)0x1;
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((uint)local_1a0.data_ & 1) == 0) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_));
  }
  free(local_c0);
  free(local_d0);
  free(local_100);
  free(local_f8);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_f0);
  free(local_128);
  free((void *)local_160._8_8_);
  free(local_150);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_148);
  if (local_190.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_190.status_,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x2fd,(char *)CONCAT71(local_170._1_7_,local_170[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0);
LAB_00129e39:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_188;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._1_7_,local_170[0]) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_170._1_7_,local_170[0]),local_160._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1a0.data_._4_4_,(uint)local_1a0.data_) + 8))();
    }
    local_168 = local_188;
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129fb1;
  }
  else {
    if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,local_188);
    }
    local_190.status_.rep_._0_4_ = OsqpSolver::Solve((OsqpSolver *)local_178);
    local_1a0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_170,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_190,(OsqpExitCode *)&local_1a0);
    if (local_170[0] != (internal)0x0) {
      if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_168,local_168);
      }
      OsqpSolver::GetPolish((OsqpSolver *)&local_190.status_);
      bVar1 = CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) == 1;
      local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,bVar1);
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_1a0,(AssertionResult *)"polish.ok()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x302,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
        goto LAB_00129f00;
      }
      if (CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != 1) {
        absl::internal_statusor::Helper::Crash(&local_190.status_);
      }
      local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,local_188._0_1_);
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_188._0_1_ ==
          (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           )0x0) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_1a0,(AssertionResult *)"*polish","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x303,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]) != &local_160) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_170._1_7_,local_170[0]),
                          local_160._M_allocated_capacity + 1);
        }
        if (local_1a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      absl::internal_statusor::StatusOrData<bool>::~StatusOrData
                ((StatusOrData<bool> *)&local_190.status_);
      OsqpSolver::UpdatePolish((OsqpSolver *)local_170,SUB81(local_178,0));
      local_190.status_.rep_._0_1_ =
           (StatusRep *)CONCAT71(local_170._1_7_,local_170[0]) == (StatusRep *)0x1;
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (((byte)local_170[0] & 1) == 0) {
        absl::status_internal::StatusRep::Unref((StatusRep *)CONCAT71(local_170._1_7_,local_170[0]))
        ;
      }
      if (local_190.status_.rep_._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_190.status_,
                   (AssertionResult *)"solver.UpdatePolish(false).ok()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x306,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1a0)
        ;
        goto LAB_00129e39;
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      OsqpSolver::GetPolish((OsqpSolver *)&local_190.status_);
      bVar1 = CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) == 1;
      local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,bVar1);
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        if (CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != 1) {
          absl::internal_statusor::Helper::Crash(&local_190.status_);
        }
        local_1a0.data_._0_4_ = CONCAT31(local_1a0.data_._1_3_,local_188._0_1_) ^ 1;
        local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_188._0_1_ !=
            (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )0x0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_170,(internal *)&local_1a0,(AssertionResult *)"*polish","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x30a,(char *)CONCAT71(local_170._1_7_,local_170[0]));
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
          goto LAB_00129f00;
        }
      }
      else {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_1a0,(AssertionResult *)"polish.ok()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x309,(char *)CONCAT71(local_170._1_7_,local_170[0]));
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1a8);
LAB_00129f00:
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_170._1_7_,local_170[0]) != &local_160) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_170._1_7_,local_170[0]),
                          local_160._M_allocated_capacity + 1);
        }
        if (local_1a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
        }
      }
      if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,local_198);
      }
      absl::internal_statusor::StatusOrData<bool>::~StatusOrData
                ((StatusOrData<bool> *)&local_190.status_);
      goto LAB_00129fb1;
    }
    testing::Message::Message((Message *)&local_190.status_);
    if (local_168 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_168->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x2fe,message);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_190.status_);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT44(local_190.status_.rep_._4_4_,local_190.status_.rep_._0_4_) + 8)
      )();
    }
    if (local_168 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00129fb1;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_168;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_168);
LAB_00129fb1:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)local_178);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdatePolish) {
  OsqpSettings settings;
  settings.polish = true;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto polish = solver.GetPolish();
    ASSERT_TRUE(polish.ok());
    EXPECT_TRUE(*polish);
  }

  ASSERT_TRUE(solver.UpdatePolish(false).ok());
  {
    const auto polish = solver.GetPolish();
    ASSERT_TRUE(polish.ok());
    EXPECT_FALSE(*polish);
  }
}